

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::~IfcComplexProperty(IfcComplexProperty *this)

{
  pointer pLVar1;
  undefined1 *puVar2;
  pointer pcVar3;
  
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8be6e8;
  *(undefined8 *)&this->field_0xa0 = 0x8be738;
  *(undefined8 *)&(this->super_IfcProperty).field_0x58 = 0x8be710;
  pLVar1 = (this->HasProperties).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcProperty).field_0x68;
  if (puVar2 != &this->field_0x78) {
    operator_delete(puVar2);
  }
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8be760;
  *(undefined8 *)&this->field_0xa0 = 0x8be788;
  pcVar3 = (this->super_IfcProperty).Description.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_IfcProperty).Description.ptr.field_2) {
    operator_delete(pcVar3);
  }
  puVar2 = *(undefined1 **)
            &(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>
             .field_0x10;
  if (puVar2 != &(this->super_IfcProperty).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x20) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}